

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O2

bool __thiscall
CPubKey::Verify(CPubKey *this,uint256 *hash,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig)

{
  byte bVar1;
  long lVar2;
  uchar *input;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  size_t sStack_b0;
  secp256k1_ecdsa_signature sig;
  secp256k1_pubkey pubkey;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = this->vch[0];
  if ((bVar1 & 0xfe) == 2) {
    sStack_b0 = 0x21;
  }
  else {
    bVar4 = false;
    if ((7 < bVar1) || ((0xd0U >> (bVar1 & 0x1f) & 1) == 0)) goto LAB_00631520;
    if ((bVar1 < 8) && ((0xd0U >> (bVar1 & 0x1f) & 1) != 0)) {
      sStack_b0 = 0x41;
    }
    else {
      sStack_b0 = 0;
    }
  }
  iVar3 = secp256k1_ec_pubkey_parse(secp256k1_context_static,&pubkey,this->vch,sStack_b0);
  if ((iVar3 == 0) ||
     (input = (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start,
     iVar3 = ecdsa_signature_parse_der_lax
                       (&sig,input,
                        (long)(vchSig->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)input), iVar3 == 0))
  {
    bVar4 = false;
  }
  else {
    secp256k1_ecdsa_signature_normalize(secp256k1_context_static,&sig,&sig);
    iVar3 = secp256k1_ecdsa_verify(secp256k1_context_static,&sig,(uchar *)hash,&pubkey);
    bVar4 = iVar3 != 0;
  }
LAB_00631520:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CPubKey::Verify(const uint256 &hash, const std::vector<unsigned char>& vchSig) const {
    if (!IsValid())
        return false;
    secp256k1_pubkey pubkey;
    secp256k1_ecdsa_signature sig;
    if (!secp256k1_ec_pubkey_parse(secp256k1_context_static, &pubkey, vch, size())) {
        return false;
    }
    if (!ecdsa_signature_parse_der_lax(&sig, vchSig.data(), vchSig.size())) {
        return false;
    }
    /* libsecp256k1's ECDSA verification requires lower-S signatures, which have
     * not historically been enforced in Bitcoin, so normalize them first. */
    secp256k1_ecdsa_signature_normalize(secp256k1_context_static, &sig, &sig);
    return secp256k1_ecdsa_verify(secp256k1_context_static, &sig, hash.begin(), &pubkey);
}